

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

NodePtr __thiscall avro::NodeSymbolic::getNode(NodeSymbolic *this)

{
  Exception *this_00;
  Name *x;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  shared_count extraout_RDX;
  long *in_RSI;
  NodePtr NVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>((shared_ptr<avro::Node> *)this,in_RSI + 0xb)
  ;
  if ((this->super_NodeImplSymbolic).super_Node._vptr_Node != (_func_int **)0x0) {
    NVar1.pn.pi_ = extraout_RDX.pi_;
    NVar1.px = (element_type *)this;
    return NVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_100,"Could not follow symbol %1%");
  x = (Name *)(**(code **)(*in_RSI + 0x18))();
  msg = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,avro::Name_const&>
                  (&local_100,x);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodePtr getNode() const {
        NodePtr node = actualNode_.lock();
        if(!node) {
            throw Exception(boost::format("Could not follow symbol %1%") % name());
        }
        return node;
    }